

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QMimeData * __thiscall QTreeModel::mimeData(QTreeModel *this,QModelIndexList *indexes)

{
  iterator abegin;
  iterator aend;
  iterator iVar1;
  QTreeWidget *pQVar2;
  QMimeData *pQVar3;
  QList<QModelIndex> *in_RDI;
  long in_FS_OFFSET;
  QMimeData *mimeData;
  QList<QTreeWidgetItem_*> items;
  QList<QModelIndex> *in_stack_ffffffffffffff28;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffff38;
  back_insert_iterator<QList<QTreeWidgetItem_*>_> __result;
  const_iterator in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff58;
  const_iterator local_38;
  const_iterator local_30;
  QList<QTreeWidgetItem_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QTreeWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  __result.container = &local_28;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x91140c);
  QList<QModelIndex>::begin(in_RDI);
  QList<QModelIndex>::end(in_RDI);
  std::back_inserter<QList<QTreeWidgetItem*>>((QList<QTreeWidgetItem_*> *)in_RDI);
  std::
  transform<QList<QModelIndex>::const_iterator,std::back_insert_iterator<QList<QTreeWidgetItem*>>,QTreeModel::mimeData(QList<QModelIndex>const&)const::__0>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,__result,in_stack_ffffffffffffff38)
  ;
  abegin = QList<QTreeWidgetItem_*>::begin((QList<QTreeWidgetItem_*> *)in_RDI);
  aend = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)in_RDI);
  std::sort<QList<QTreeWidgetItem*>::iterator>
            ((iterator)in_stack_ffffffffffffff48.i,(iterator)__result.container);
  QList<QTreeWidgetItem_*>::begin((QList<QTreeWidgetItem_*> *)in_RDI);
  QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)in_RDI);
  iVar1 = std::unique<QList<QTreeWidgetItem*>::iterator>
                    (in_stack_ffffffffffffff58,(iterator)in_stack_ffffffffffffff50.i);
  QList<QTreeWidgetItem_*>::const_iterator::const_iterator(&local_30,iVar1);
  iVar1 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)in_RDI);
  QList<QTreeWidgetItem_*>::const_iterator::const_iterator(&local_38,iVar1);
  QList<QTreeWidgetItem_*>::erase
            ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff50.i,(const_iterator)abegin.i,
             (const_iterator)aend.i);
  QList<QModelIndex>::operator=(in_RDI,in_stack_ffffffffffffff28);
  pQVar2 = view((QTreeModel *)0x91154c);
  pQVar3 = (QMimeData *)
           (**(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.
                                  super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x318))
                     (pQVar2,__result.container);
  QList<QModelIndex>::clear(in_RDI);
  QList<QTreeWidgetItem_*>::~QList((QList<QTreeWidgetItem_*> *)0x911583);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTreeModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTreeWidgetItem *> items;
    std::transform(indexes.begin(), indexes.end(), std::back_inserter(items),
                   [this](const QModelIndex &idx) -> QTreeWidgetItem * { return item(idx); });

    // Ensure we only have one item as an item may have more than
    // one index selected if there is more than one column
    std::sort(items.begin(), items.end());
    items.erase(std::unique(items.begin(), items.end()), items.end());

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(items);
    cachedIndexes.clear();
    return mimeData;
}